

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O2

int __thiscall ncnn::Convolution1D::load_param(Convolution1D *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  Mat local_b0;
  Mat local_68;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->num_output = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar1;
  iVar1 = ParamDict::get(pd,2,1);
  this->dilation_w = iVar1;
  iVar1 = ParamDict::get(pd,3,1);
  this->stride_w = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->pad_left = iVar1;
  iVar1 = ParamDict::get(pd,0xf,iVar1);
  this->pad_right = iVar1;
  fVar2 = ParamDict::get(pd,0x12,0.0);
  this->pad_value = fVar2;
  iVar1 = ParamDict::get(pd,5,0);
  this->bias_term = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->weight_data_size = iVar1;
  iVar1 = ParamDict::get(pd,9,0);
  this->activation_type = iVar1;
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b0,pd,10,&local_68);
  Mat::operator=(&this->activation_params,&local_b0);
  Mat::~Mat(&local_b0);
  Mat::~Mat(&local_68);
  iVar1 = ParamDict::get(pd,0x13,0);
  this->dynamic_weight = iVar1;
  if (iVar1 != 0) {
    (this->super_Layer).one_blob_only = false;
  }
  return 0;
}

Assistant:

int Convolution1D::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    dilation_w = pd.get(2, 1);
    stride_w = pd.get(3, 1);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    pad_value = pd.get(18, 0.f);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());

    dynamic_weight = pd.get(19, 0);

    if (dynamic_weight)
    {
        one_blob_only = false;
    }

    return 0;
}